

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O3

uint32_t radix8sort_u64(uint64_t *keys_in_out,uint64_t *keys_temp,uint32_t *values_in_out,
                       uint32_t *values_temp,uint32_t size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint32_t bucket;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint32_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t *values [2];
  uint64_t *keys [2];
  uint32_t hist [1717];
  uint32_t *local_2068 [2];
  uint64_t *local_2058 [3];
  uint32_t *local_2040;
  uint32_t local_2038 [2050];
  
  local_2040 = values_temp;
  memset(local_2038,0,0x2000);
  uVar10 = 0;
  if (size != 0) {
    uVar5 = 0;
    do {
      uVar10 = keys_in_out[uVar5];
      lVar7 = 0;
      puVar8 = local_2038;
      do {
        puVar8[uVar10 >> ((byte)lVar7 & 0x3f) & 0xff] =
             puVar8[uVar10 >> ((byte)lVar7 & 0x3f) & 0xff] + 1;
        puVar8 = puVar8 + 0x100;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x40);
      uVar5 = uVar5 + 1;
      uVar10 = (ulong)size;
    } while (uVar5 != size);
  }
  sum_histograms(8,0x100,local_2038);
  local_2058[0] = keys_in_out;
  local_2058[1] = keys_temp;
  local_2068[0] = values_in_out;
  local_2068[1] = local_2040;
  lVar7 = 0;
  do {
    if (size != 0) {
      uVar6 = (uint)lVar7 & 1;
      uVar5 = (ulong)(uVar6 << 3);
      uVar9 = (ulong)((uVar6 ^ 1) << 3);
      lVar1 = *(long *)((long)local_2058 + uVar5);
      lVar2 = *(long *)((long)local_2058 + uVar9);
      lVar3 = *(long *)((long)local_2068 + uVar5);
      lVar4 = *(long *)((long)local_2068 + uVar9);
      uVar5 = 0;
      do {
        uVar9 = *(ulong *)(lVar1 + uVar5 * 8);
        uVar11 = uVar9 >> ((char)lVar7 * '\b' & 0x3fU) & 0xff;
        uVar6 = local_2038[lVar7 * 0x100 + uVar11];
        local_2038[lVar7 * 0x100 + uVar11] = uVar6 + 1;
        *(ulong *)(lVar2 + (ulong)uVar6 * 8) = uVar9;
        *(undefined4 *)(lVar4 + (ulong)uVar6 * 4) = *(undefined4 *)(lVar3 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar5);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  return 0;
}

Assistant:

uint32_t radix8sort_u64(uint64_t* restrict keys_in_out, uint64_t* restrict keys_temp,
    uint32_t* restrict values_in_out, uint32_t* values_temp, uint32_t size)
{
    return radixsort_u64(8, keys_in_out, keys_temp, values_in_out, values_temp, size);
}